

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall
gmlc::networking::TcpServer::handle_accept(TcpServer *this,pointer *acc,pointer *new_connection)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TcpConnection *pTVar4;
  TcpAcceptor *this_00;
  int iVar5;
  _Any_data *p_Var6;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  undefined1 *puVar7;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_a8;
  undefined1 local_98 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Any_data local_68;
  code *local_58;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  local_48;
  
  peVar1 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_Socket[0xe])(peVar2,1,0);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  iVar5 = 1;
  (*peVar2->_vptr_Socket[0xc])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pTVar4 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((this->halted)._M_base._M_i & 1U) != 0) {
    TcpConnection::close(pTVar4,iVar5);
    return;
  }
  peVar2 = (pTVar4->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->handshake_server_ = true;
  (*peVar2->_vptr_Socket[6])();
  pTVar4 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::function(&local_48,&this->dataCall);
  TcpConnection::setDataCall(pTVar4,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)(&local_48,&local_48,3);
  }
  pTVar4 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var6 = &local_68;
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
            *)p_Var6,&this->errorCall);
  TcpConnection::setErrorCall
            (pTVar4,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                     *)p_Var6);
  iVar5 = (int)p_Var6;
  if (local_58 != (code *)0x0) {
    p_Var6 = &local_68;
    (*local_58)(p_Var6,p_Var6,__destroy_functor);
    iVar5 = (int)p_Var6;
  }
  if ((this->logFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
    pTVar4 = (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    this_01 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)(local_98 + 0x10);
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(this_01,&this->logFunction);
    TcpConnection::setLoggingFunction(pTVar4,this_01);
    iVar5 = (int)this_01;
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      puVar7 = local_98 + 0x10;
      (*(code *)local_78._M_pi)(puVar7,puVar7,3);
      iVar5 = (int)puVar7;
    }
  }
  TcpConnection::startReceive
            ((new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  local_a8._M_device = &this->accepting;
  local_a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_a8);
  local_a8._M_owns = true;
  if (((this->halted)._M_base._M_i & 1U) == 0) {
    std::
    vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>
    ::emplace_back<std::shared_ptr<gmlc::networking::TcpConnection>>
              ((vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>
                *)&this->connections,new_connection);
    std::unique_lock<std::mutex>::~unique_lock(&local_a8);
    this_00 = (acc->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    TcpConnection::create
              ((TcpConnection *)local_98,&this->socket_factory,this->ioctx,this->bufferSize);
    TcpAcceptor::start(this_00,(pointer *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  else {
    std::unique_lock<std::mutex>::unlock(&local_a8);
    TcpConnection::close
              ((new_connection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,iVar5);
    std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  }
  return;
}

Assistant:

void TcpServer::handle_accept(
    TcpAcceptor::pointer acc,
    TcpConnection::pointer new_connection)
{
    /*setting linger to 1 second*/
    new_connection->socket()->set_option_linger(true, 0);
    new_connection->socket()->set_option_no_delay(true);
    // Set options here
    if (halted.load()) {
        new_connection->close();
        return;
    }

    new_connection->setHandshakeModeServer();
    new_connection->handshake();

    new_connection->setDataCall(dataCall);
    new_connection->setErrorCall(errorCall);
    if (logFunction) {
        new_connection->setLoggingFunction(logFunction);
    }
    new_connection->startReceive();
    {  // scope for the lock_guard

        std::unique_lock<std::mutex> lock(accepting);
        if (!halted.load()) {
            connections.push_back(std::move(new_connection));
        } else {
            lock.unlock();
            new_connection->close();
            return;
        }
    }
    acc->start(TcpConnection::create(socket_factory, ioctx, bufferSize));
}